

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_init_pos_CN_pos_VN_Test::
rate_adaptive_code_from_colptr_rowIdx_init_pos_CN_pos_VN_Test
          (rate_adaptive_code_from_colptr_rowIdx_init_pos_CN_pos_VN_Test *this)

{
  rate_adaptive_code_from_colptr_rowIdx_init_pos_CN_pos_VN_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__rate_adaptive_code_from_colptr_rowIdx_init_pos_CN_pos_VN_Test_00231890;
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, init_pos_CN_pos_VN) {
    auto H = get_code_small();

    std::vector<std::vector<decltype(H)::MatrixIndex>> expect_posCN{{0},
                                                                    {1},
                                                                    {0, 1},
                                                                    {2},
                                                                    {0, 2},
                                                                    {1, 2},
                                                                    {0, 1, 2}};
    std::vector<std::vector<decltype(H)::MatrixIndex>> expect_posVN{{0, 2, 4, 6},
                                                                    {1, 2, 5, 6},
                                                                    {3, 4, 5, 6}};
    EXPECT_EQ(H.getPosVarn(), expect_posVN);
    EXPECT_EQ(H.getPosCheckn(), expect_posCN);
}